

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_unpacked_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRExpression *pSVar4;
  SPIRType *pSVar5;
  byte bVar6;
  string local_50;
  
  pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
  if (pSVar4 == (SPIRExpression *)0x0) {
    bVar6 = 1;
  }
  else {
    bVar6 = pSVar4->need_transpose ^ 1;
  }
  bVar1 = Compiler::has_extended_decoration
                    (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypeID);
  bVar2 = Compiler::has_extended_decoration
                    (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypePacked);
  if ((bVar6 == 0) || (!bVar1 && !bVar2)) {
    to_expression_abi_cxx11_(__return_storage_ptr__,this,id,register_expression_read);
  }
  else {
    to_expression_abi_cxx11_(&local_50,this,id,register_expression_read);
    uVar3 = Compiler::expression_type_id(&this->super_Compiler,id);
    pSVar5 = Compiler::get_pointee_type(&this->super_Compiler,uVar3);
    uVar3 = Compiler::get_extended_decoration
                      (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypeID);
    bVar1 = Compiler::has_extended_decoration
                      (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypePacked);
    (*(this->super_Compiler)._vptr_Compiler[0x24])
              (__return_storage_ptr__,this,&local_50,pSVar5,(ulong)uVar3,(ulong)bVar1,0);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_unpacked_expression(uint32_t id, bool register_expression_read)
{
	// If we need to transpose, it will also take care of unpacking rules.
	auto *e = maybe_get<SPIRExpression>(id);
	bool need_transpose = e && e->need_transpose;
	bool is_remapped = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
	bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);

	if (!need_transpose && (is_remapped || is_packed))
	{
		return unpack_expression_type(to_expression(id, register_expression_read),
		                              get_pointee_type(expression_type_id(id)),
		                              get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID),
		                              has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked), false);
	}
	else
		return to_expression(id, register_expression_read);
}